

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O0

int get_weight(int param_1,int param_2)

{
  int *local_20;
  ENode *node;
  int end_local;
  int start_local;
  
  if (param_1 == param_2) {
    end_local = 0;
  }
  else {
    for (local_20 = *(int **)(&stack0x00000018 + (long)param_1 * 0x10); local_20 != (int *)0x0;
        local_20 = *(int **)(local_20 + 2)) {
      if (param_2 == *local_20) {
        return local_20[1];
      }
    }
    end_local = 0x7fffffff;
  }
  return end_local;
}

Assistant:

int get_weight(LGraph G, int start, int end)
{
    ENode *node;

    if (start==end)
        return 0;

    node = G.vexs[start].first_edge;
    while (node!=NULL)
    {
        if (end==node->ivex)
            return node->weight;
        node = node->next_edge;
    }

    return INF;
}